

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O1

LispPTR get_ivar_name(frameex1 *fx_addr68k,DLword offset,int *localivar)

{
  LispPTR *pLVar1;
  long lVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  LispPTR *pLVar6;
  uint *puVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = (ulong)fx_addr68k->fnheader;
  if ((fx_addr68k->fnheader & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar11);
  }
  uVar3 = Lisp_world[uVar11 + 7];
  uVar8 = (ulong)uVar3;
  if (uVar8 == 0) {
    pLVar6 = (LispPTR *)(Lisp_world + uVar11 + 0xc);
    puVar7 = (uint *)(Lisp_world +
                     uVar11 + (long)((int)(Lisp_world[uVar11 + 2] - 0x18) >> 3) * 2 + 0xc);
  }
  else {
    pLVar1 = (LispPTR *)(Lisp_world + uVar11 + 8);
    bVar12 = true;
    pLVar6 = pLVar1;
    if (*(uint *)(Lisp_world + uVar11 + uVar8 + 8) != (uint)offset) {
      lVar10 = 0;
      do {
        if (uVar3 - 1 == (int)lVar10) goto LAB_00114ef1;
        pLVar6 = pLVar6 + 1;
        lVar2 = lVar10 + 1;
        lVar5 = lVar10 * 2;
        lVar10 = lVar2;
      } while (*(uint *)(Lisp_world + uVar11 + uVar8 + lVar5 + 10) != (uint)offset);
      bVar12 = (uint)lVar2 < (uint)uVar3;
    }
    if ((bVar12) && (iVar9 = 0, *pLVar6 != 0)) goto LAB_00114f42;
LAB_00114ef1:
    pLVar6 = pLVar1 + uVar8;
    puVar7 = pLVar6 + ((long)((long)Lisp_world +
                             (((ulong)(Lisp_world[uVar11 + 2] & 0xfffffffe) + uVar11 * 2) -
                             (long)pLVar6)) >> 3);
  }
  iVar9 = 1;
  uVar4 = *puVar7;
  while (uVar4 != offset) {
    puVar7 = puVar7 + 1;
    pLVar6 = pLVar6 + 1;
    uVar4 = *puVar7;
  }
LAB_00114f42:
  *localivar = iVar9;
  return *pLVar6;
}

Assistant:

LispPTR get_ivar_name(struct frameex1 *fx_addr68k, DLword offset, int *localivar) {
  NAMETABLE *first_table;
  NAMETABLE *second_table;
  struct fnhead *fnobj;
  int i;
#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr((fx_addr68k)->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)(fx_addr68k)->hi2fnheader << 16) |
                                              (fx_addr68k)->lofnheader);
#endif /* BIGVM */
  if (fnobj->ntsize > 0) {
    /* name table exists */
    first_table = (NAMETABLE *)(fnobj + 1);
    second_table = (NAMETABLE *)((DLword *)first_table + fnobj->ntsize);

    for (i = 0; (i < fnobj->ntsize) && (GetNTEntry(second_table) != offset);
         first_table++, second_table++, i++)
      ;
    if ((i < fnobj->ntsize) && (GetNTEntry(first_table) != 0)) {
      /* target ivar was in name table */
      *localivar = 0;
      return ((LispPTR)(GetNTEntry(first_table)));
    } else {
/* Target ivar is in locar vars table */
#ifdef BIGATOMS
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize);
      second_table =
          first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - (DLword *)first_table) >> 2);
#else
      first_table = (NAMETABLE *)(fnobj + 1) + (fnobj->ntsize << 1);
      second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
    }
  } else {
/* name table doesn't exist, so all ivars are in locar vars table */
#ifdef BIGATOMS
    int delta;
    first_table = (NAMETABLE *)(fnobj + 1) + (4 >> 1);
    delta = (DLword *)(((DLword *)fnobj) + (fnobj->startpc >> 1)) - (DLword *)first_table;
    second_table = first_table + (delta >> 2);
#else
    first_table = (NAMETABLE *)(fnobj + 1) + 4;
    second_table = first_table + (((DLword *)fnobj + (fnobj->startpc >> 1) - first_table) >> 1);
#endif
  }
#ifdef BIGATOMS
  while (*(second_table) != (VTY_IVAR | offset))
#else
  while (GETWORD(second_table) != (VTY_IVAR | offset))
#endif /* BIGATOMS */

  {
    first_table++;
    second_table++;
  }
  *localivar = 1;

#ifdef BIGATOMS
  return ((LispPTR)(*(first_table)));
#else
  return ((LispPTR)(GETWORD(first_table)));
#endif /* BIGATOMS */

}